

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O3

int32_t icu_63::MessagePattern::validateArgumentName(UnicodeString *name)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int32_t iVar4;
  char16_t *s;
  
  uVar1 = (name->fUnion).fStackFields.fLengthAndFlags;
  if ((uVar1 & 0x11) == 0) {
    if ((uVar1 & 2) == 0) {
      s = (name->fUnion).fFields.fArray;
    }
    else {
      s = (name->fUnion).fStackFields.fBuffer;
    }
  }
  else {
    s = (char16_t *)0x0;
  }
  if ((short)uVar1 < 0) {
    iVar4 = (name->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)(short)uVar1 >> 5;
  }
  UVar3 = PatternProps::isIdentifier(s,iVar4);
  if (UVar3 != '\0') {
    sVar2 = (name->fUnion).fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar4 = (name->fUnion).fFields.fLength;
    }
    else {
      iVar4 = (int)sVar2 >> 5;
    }
    iVar4 = parseArgNumber(name,0,iVar4);
    return iVar4;
  }
  return -2;
}

Assistant:

int32_t
MessagePattern::validateArgumentName(const UnicodeString &name) {
    if(!PatternProps::isIdentifier(name.getBuffer(), name.length())) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    return parseArgNumber(name, 0, name.length());
}